

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  pointer ptVar7;
  void *pvVar8;
  pointer ptVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long *plVar14;
  long lVar15;
  char *pcVar16;
  ostream *poVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  long *plVar21;
  ulong uVar22;
  int *piVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  int i;
  pointer ptVar29;
  int i_2;
  int i_1;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  uint __uval;
  string __str;
  int scanfint;
  char *pcStack_140;
  long local_138;
  vector<time_result,_std::allocator<time_result>_> results;
  vector<time_result,_std::allocator<time_result>_> results_1;
  ulong local_d0;
  char cstr [16];
  long *local_b0;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ulong local_50;
  char str [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, World!",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  str[0] = '\0';
  str[1] = '\0';
  str[2] = '\0';
  str[3] = '\0';
  str[4] = '\0';
  str[5] = '\0';
  str[6] = '\0';
  str[7] = '\0';
  str[8] = '\0';
  str[9] = '\0';
  str[10] = '\0';
  str[0xb] = '\0';
  str[0xc] = '\0';
  str[0xd] = '\0';
  str[0xe] = '\0';
  str[0xf] = '\0';
  cstr[0] = '\0';
  cstr[1] = '\0';
  cstr[2] = '\0';
  cstr[3] = '\0';
  cstr[4] = '\0';
  cstr[5] = '\0';
  cstr[6] = '\0';
  cstr[7] = '\0';
  cstr[8] = '\0';
  cstr[9] = '\0';
  cstr[10] = '\0';
  cstr[0xb] = '\0';
  cstr[0xc] = '\0';
  cstr[0xd] = '\0';
  cstr[0xe] = '\0';
  cstr[0xf] = '\0';
  lVar27 = 0;
  do {
    uVar31 = *(uint *)((long)&DAT_001064b0 + lVar27);
    uVar19 = (ulong)uVar31;
    local_d0 = (ulong)-uVar31;
    uVar13 = uVar31;
    if ((int)uVar31 < 1) {
      uVar13 = -uVar31;
    }
    uVar30 = 1;
    if (9 < uVar13) {
      uVar20 = (ulong)uVar13;
      uVar25 = 4;
      do {
        uVar30 = uVar25;
        uVar10 = (uint)uVar20;
        if (uVar10 < 100) {
          uVar30 = uVar30 - 2;
          goto LAB_00102446;
        }
        if (uVar10 < 1000) {
          uVar30 = uVar30 - 1;
          goto LAB_00102446;
        }
        if (uVar10 < 10000) goto LAB_00102446;
        uVar20 = uVar20 / 10000;
        uVar25 = uVar30 + 4;
      } while (99999 < uVar10);
      uVar30 = uVar30 + 1;
    }
LAB_00102446:
    uVar20 = (ulong)(uVar31 >> 0x1f);
    cVar4 = (char)((int)uVar31 >> 0x1f);
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct((ulong)&results_1,(char)uVar30 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(results_1.
                                super__Vector_base<time_result,_std::allocator<time_result>_>.
                                _M_impl.super__Vector_impl_data._M_start)->time + uVar20),uVar30,
               uVar13);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&results_1,0,(char *)0x0,0x1060fb);
    local_70 = &local_60;
    plVar21 = plVar14 + 2;
    if ((long *)*plVar14 == plVar21) {
      local_60 = *plVar21;
      lStack_58 = plVar14[3];
    }
    else {
      local_60 = *plVar21;
      local_70 = (long *)*plVar14;
    }
    local_68 = plVar14[1];
    *plVar14 = (long)plVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138 = 0;
    _scanfint = (void *)0x0;
    pcStack_140 = (char *)0x0;
    lVar24 = 1000000;
    lVar15 = std::chrono::_V2::steady_clock::now();
    do {
      iVar11 = sprintf(str,"%d",uVar19);
      if (iVar11 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
    lVar24 = std::chrono::_V2::steady_clock::now();
    __str._M_dataplus._M_p = (pointer)(((double)(lVar24 - lVar15) / 1000.0) / 1000000.0);
    __str._M_string_length = (size_type)anon_var_dwarf_77cc;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&__str);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfint,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    lVar15 = std::chrono::_V2::steady_clock::now();
    lVar24 = 0;
    do {
      uVar30 = 1;
      if (9 < uVar13) {
        uVar22 = (ulong)uVar13;
        uVar25 = 4;
        do {
          uVar30 = uVar25;
          uVar10 = (uint)uVar22;
          if (uVar10 < 100) {
            uVar30 = uVar30 - 2;
            goto LAB_0010261a;
          }
          if (uVar10 < 1000) {
            uVar30 = uVar30 - 1;
            goto LAB_0010261a;
          }
          if (uVar10 < 10000) goto LAB_0010261a;
          uVar22 = uVar22 / 10000;
          uVar25 = uVar30 + 4;
        } while (99999 < uVar10);
        uVar30 = uVar30 + 1;
      }
LAB_0010261a:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar30 - cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar20,uVar30,uVar13)
      ;
      cVar28 = *__str._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT26(__str.field_2._M_allocated_capacity._6_2_,
                                 __str.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (cVar28 == '+') {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 1000000);
    lVar24 = std::chrono::_V2::steady_clock::now();
    __str._M_dataplus._M_p = (pointer)(((double)(lVar24 - lVar15) / 1000.0) / 1000000.0);
    __str._M_string_length = (size_type)anon_var_dwarf_77e5;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&__str);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfint,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    lVar15 = std::chrono::_V2::steady_clock::now();
    lVar24 = 0;
    do {
      iVar11 = 1;
      pcVar16 = cstr;
      uVar22 = uVar19;
      if ((int)uVar31 < 0) {
        cstr[0] = '-';
        iVar11 = 2;
        pcVar16 = cstr + 1;
        uVar22 = local_d0;
      }
      bVar32 = false;
      lVar26 = 0;
      do {
        uVar30 = *(uint *)((long)&DAT_001064d4 + lVar26);
        cVar28 = '0';
        if ((uint)uVar22 < uVar30) {
          if (bVar32) goto LAB_0010274f;
          bVar32 = false;
        }
        else {
          do {
            uVar25 = (int)uVar22 - uVar30;
            uVar22 = (ulong)uVar25;
            cVar28 = cVar28 + '\x01';
          } while (uVar30 <= uVar25);
LAB_0010274f:
          *pcVar16 = cVar28;
          pcVar16 = pcVar16 + 1;
          iVar11 = iVar11 + 1;
          bVar32 = true;
        }
        lVar26 = lVar26 + 4;
      } while (lVar26 != 0x24);
      *pcVar16 = (char)uVar22 + '0';
      pcVar16[1] = '\0';
      if (iVar11 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 1000000);
    lVar24 = std::chrono::_V2::steady_clock::now();
    __str._M_dataplus._M_p = (pointer)(((double)(lVar24 - lVar15) / 1000.0) / 1000000.0);
    __str._M_string_length = (size_type)anon_var_dwarf_77fe;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&__str);
    ptVar9 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfint,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    ptVar7 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start != ptVar9) {
      lVar24 = (long)ptVar9 -
               (long)results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar22 = lVar24 >> 4;
      lVar15 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::operator()(results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                      super__Vector_impl_data._M_start,ptVar9,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar24 < 0x101) {
        std::operator()(ptVar7,ptVar9);
      }
      else {
        ptVar29 = ptVar7 + 0x10;
        std::operator()(ptVar7,ptVar29);
        for (; ptVar29 != ptVar9; ptVar29 = ptVar29 + 1) {
          dVar3 = ptVar29->time;
          pcVar16 = ptVar29->desc;
          dVar2 = ptVar29[-1].time;
          ptVar7 = ptVar29;
          while (dVar3 < dVar2) {
            pcVar5 = ptVar7[-1].desc;
            ptVar7->time = ptVar7[-1].time;
            ptVar7->desc = pcVar5;
            dVar2 = ptVar7[-2].time;
            ptVar7 = ptVar7 + -1;
          }
          ptVar7->time = dVar3;
          ptVar7->desc = pcVar16;
        }
      }
    }
    bench::console::separator();
    printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",local_70,
           "\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
    ptVar7 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    printf(anon_var_dwarf_7f4b,
           SUB84((results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_start)->time,0),
           SUB84(1000000.0 /
                 (results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_start)->time,0),"\x1b[0;32m",0xf,
           (results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
            super__Vector_impl_data._M_start)->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
    uVar22 = (long)results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar7 >> 4;
    if (1 < uVar22) {
      lVar24 = 2;
      lVar15 = 3;
      do {
        dVar3 = *(double *)((long)ptVar7 + lVar15 * 8 + -8);
        printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar3 / ptVar7->time,0),
               SUB84(dVar3,0),1000000.0 / dVar3,"\x1b[0;37m",lVar24,0xf,(&ptVar7->time)[lVar15],
               "\x1b[0;91m",(ulong)((int)lVar15 + 1)," ","\x1b[0m");
        lVar26 = (1 - uVar22) + lVar24;
        lVar24 = lVar24 + 1;
        lVar15 = lVar15 + 2;
      } while (lVar26 != 1);
    }
    puts("\n");
    lVar15 = local_138;
    pvVar8 = _scanfint;
    operator_delete(ptVar7,(long)results.
                                 super__Vector_base<time_result,_std::allocator<time_result>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar7);
    if (pvVar8 != (void *)0x0) {
      operator_delete(pvVar8,lVar15 - (long)pvVar8);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(results_1.
                                      super__Vector_base<time_result,_std::allocator<time_result>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage)->time + 1))
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"konvert   : ",0xc);
    iVar11 = 1;
    pcVar16 = cstr;
    uVar22 = uVar19;
    if ((int)uVar31 < 0) {
      cstr[0] = '-';
      iVar11 = 2;
      pcVar16 = cstr + 1;
      uVar22 = local_d0;
    }
    bVar32 = false;
    lVar15 = 0;
    do {
      uVar31 = *(uint *)((long)&DAT_001064d4 + lVar15);
      cVar28 = '0';
      if ((uint)uVar22 < uVar31) {
        if (bVar32) goto LAB_00102adf;
        bVar32 = false;
      }
      else {
        do {
          uVar30 = (int)uVar22 - uVar31;
          uVar22 = (ulong)uVar30;
          cVar28 = cVar28 + '\x01';
        } while (uVar31 <= uVar30);
LAB_00102adf:
        *pcVar16 = cVar28;
        pcVar16 = pcVar16 + 1;
        iVar11 = iVar11 + 1;
        bVar32 = true;
      }
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x24);
    *pcVar16 = (char)uVar22 + '0';
    pcVar16[1] = '\0';
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," = \"",4);
    sVar18 = strlen(cstr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,cstr,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"sprintf   : ",0xc);
    iVar11 = sprintf(str,"%d",uVar19);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," = \"",4);
    sVar18 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,str,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"to_string : \"",0xd);
    uVar31 = 1;
    if (9 < uVar13) {
      uVar30 = uVar13;
      uVar25 = 4;
      do {
        uVar31 = uVar25;
        if (uVar30 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_00102c33;
        }
        if (uVar30 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_00102c33;
        }
        if (uVar30 < 10000) goto LAB_00102c33;
        bVar32 = 99999 < uVar30;
        uVar30 = uVar30 / 10000;
        uVar25 = uVar31 + 4;
      } while (bVar32);
      uVar31 = uVar31 + 1;
    }
LAB_00102c33:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar31 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar20,uVar31,uVar13);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,__str._M_dataplus._M_p,__str._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,
                      CONCAT26(__str.field_2._M_allocated_capacity._6_2_,
                               __str.field_2._M_allocated_capacity._0_6_) + 1);
    }
    lVar27 = lVar27 + 4;
  } while (lVar27 != 0x24);
  iVar11 = 0;
  pcVar16 = 
  "42            -1            666666666666  -666          -23489535     0             1028455535    -502345535    202345535     1232348935    450234535     9999999999999 026026        4             502348965     "
  ;
  do {
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    local_b0 = &local_a0;
    __str.field_2._8_6_ = (undefined6)((ulong)*(undefined8 *)(pcVar16 + 6) >> 0x10);
    __str.field_2._M_allocated_capacity._0_6_ = (undefined6)*(undefined8 *)pcVar16;
    __str.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)*(undefined8 *)pcVar16 >> 0x30);
    __str._M_string_length = 0xe;
    __str.field_2._M_local_buf[0xe] = '\0';
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x106228);
    plVar21 = plVar14 + 2;
    if ((long *)*plVar14 == plVar21) {
      local_a0 = *plVar21;
      lStack_98 = plVar14[3];
    }
    else {
      local_a0 = *plVar21;
      local_b0 = (long *)*plVar14;
    }
    *plVar14 = (long)plVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar27 = std::chrono::_V2::steady_clock::now();
    cVar4 = *pcVar16;
    uVar19 = (ulong)(cVar4 == '-');
    piVar1 = (int *)(pcVar16 + uVar19 + 5);
    cVar28 = *(char *)((long)piVar1 + -5);
    uVar31 = (int)cVar28 - 0x30;
    lVar15 = 0;
    do {
      if (uVar31 < 10) {
        uVar30 = *(int *)(pcVar16 + uVar19 + 1) + 0xcfcfcfd0;
        uVar25 = uVar30 & 0xff;
        piVar23 = piVar1;
        uVar13 = uVar31;
        if (uVar25 < 10) {
          while( true ) {
            uVar13 = uVar25 + uVar13 * 10;
            uVar25 = uVar30 >> 8 & 0xff;
            if (9 < uVar25) break;
            uVar13 = uVar25 + uVar13 * 10;
            uVar25 = uVar30 >> 0x10 & 0xff;
            if ((9 < uVar25) || (uVar13 = uVar25 + uVar13 * 10, 0x9ffffff < uVar30)) break;
            uVar13 = (uVar30 >> 0x18) + uVar13 * 10;
            uVar30 = *piVar23 + 0xcfcfcfd0;
            uVar25 = uVar30 & 0xff;
            piVar23 = piVar23 + 1;
            if (9 < uVar25) break;
          }
        }
        uVar30 = -uVar13;
        if (cVar4 != '-') {
          uVar30 = uVar13;
        }
        if (uVar30 == 0x2b) {
          puts(
              "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
              );
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 1000000);
    lVar15 = std::chrono::_V2::steady_clock::now();
    _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
    pcStack_140 = "konvert";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfint);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    lVar15 = 1000000;
    lVar27 = std::chrono::_V2::steady_clock::now();
    do {
      iVar12 = atoi(pcVar16);
      if (iVar12 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    lVar15 = std::chrono::_V2::steady_clock::now();
    _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
    pcStack_140 = "atoi";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfint);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    lVar15 = 1000000;
    lVar27 = std::chrono::_V2::steady_clock::now();
    do {
      lVar24 = strtol(pcVar16,(char **)0x0,10);
      if (lVar24 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    lVar15 = std::chrono::_V2::steady_clock::now();
    _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
    pcStack_140 = "strtol";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfint);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    lVar15 = 1000000;
    lVar27 = std::chrono::_V2::steady_clock::now();
    do {
      __isoc99_sscanf(pcVar16,"%d",(time_result *)&scanfint);
      if (scanfint == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    lVar15 = std::chrono::_V2::steady_clock::now();
    _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
    pcStack_140 = "scanf";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfint);
    ptVar9 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    ptVar7 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start != ptVar9) {
      lVar15 = (long)ptVar9 -
               (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_start;
      uVar20 = lVar15 >> 4;
      lVar27 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar27 == 0; lVar27 = lVar27 + -1) {
        }
      }
      std::operator()(results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start,ptVar9,
                      ((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar15 < 0x101) {
        std::operator()(ptVar7,ptVar9);
      }
      else {
        ptVar29 = ptVar7 + 0x10;
        std::operator()(ptVar7,ptVar29);
        for (; ptVar29 != ptVar9; ptVar29 = ptVar29 + 1) {
          dVar3 = ptVar29->time;
          pcVar5 = ptVar29->desc;
          dVar2 = ptVar29[-1].time;
          ptVar7 = ptVar29;
          while (dVar3 < dVar2) {
            pcVar6 = ptVar7[-1].desc;
            ptVar7->time = ptVar7[-1].time;
            ptVar7->desc = pcVar6;
            dVar2 = ptVar7[-2].time;
            ptVar7 = ptVar7 + -1;
          }
          ptVar7->time = dVar3;
          ptVar7->desc = pcVar5;
        }
      }
    }
    local_50 = (ulong)uVar31;
    bench::console::separator();
    printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",local_b0,
           "\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
    ptVar7 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    printf(anon_var_dwarf_7f4b,
           SUB84((results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_start)->time,0),
           SUB84(1000000.0 /
                 (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_start)->time,0),"\x1b[0;32m",0xf,
           (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
            super__Vector_impl_data._M_start)->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
    uVar20 = (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar7 >> 4;
    if (1 < uVar20) {
      lVar27 = 3;
      uVar22 = 2;
      do {
        dVar3 = *(double *)((long)ptVar7 + lVar27 * 8 + -8);
        printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar3 / ptVar7->time,0),
               SUB84(dVar3,0),1000000.0 / dVar3,"\x1b[0;37m",uVar22,0xf,(&ptVar7->time)[lVar27],
               "\x1b[0;91m",(ulong)((int)lVar27 + 1)," ","\x1b[0m");
        lVar27 = lVar27 + 2;
        bVar32 = uVar22 != uVar20;
        uVar22 = uVar22 + 1;
      } while (bVar32);
    }
    puts("\n");
    ptVar29 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ptVar9 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    operator_delete(ptVar7,(long)results_1.
                                 super__Vector_base<time_result,_std::allocator<time_result>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar7);
    if (ptVar9 != (pointer)0x0) {
      operator_delete(ptVar9,(long)ptVar29 - (long)ptVar9);
    }
    uVar20 = local_50;
    uVar31 = (uint)local_50;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,
                      CONCAT26(__str.field_2._M_allocated_capacity._6_2_,
                               __str.field_2._M_allocated_capacity._0_6_) + 1);
    }
    __isoc99_sscanf(pcVar16,"%d",&__str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"konvert   : ",0xc);
    uVar13 = 0;
    if (uVar31 < 10) {
      uVar13 = *(int *)(pcVar16 + uVar19 + 1) + 0xcfcfcfd0;
      uVar30 = uVar13 & 0xff;
      piVar23 = piVar1;
      if (uVar30 < 10) {
        while( true ) {
          uVar31 = uVar30 + (int)uVar20 * 10;
          uVar30 = uVar13 >> 8 & 0xff;
          if (9 < uVar30) break;
          uVar31 = uVar30 + uVar31 * 10;
          uVar30 = uVar13 >> 0x10 & 0xff;
          if ((9 < uVar30) || (uVar31 = uVar30 + uVar31 * 10, 0x9ffffff < uVar13)) break;
          uVar31 = (uVar13 >> 0x18) + uVar31 * 10;
          uVar20 = (ulong)uVar31;
          uVar13 = *piVar23 + 0xcfcfcfd0;
          uVar30 = uVar13 & 0xff;
          piVar23 = piVar23 + 1;
          if (9 < uVar30) break;
        }
      }
      uVar13 = -uVar31;
      if (cVar4 != '-') {
        uVar13 = uVar31;
      }
    }
    plVar14 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar13);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"konvert_l : ",0xc);
    if ((int)cVar28 - 0x30U < 10) {
      iVar12 = *(int *)(pcVar16 + uVar19 + 1);
      while ((((uVar31 = iVar12 + 0xcfcfcfd0, (uVar31 & 0xfe) < 10 && ((uVar31 & 0xfe00) < 0xa00))
              && ((uVar31 & 0xfe0000) < 0xa0000)) && (uVar31 < 0xa000000))) {
        iVar12 = *piVar1;
        piVar1 = piVar1 + 1;
      }
    }
    poVar17 = std::ostream::_M_insert<long>((long)poVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"atoi      : ",0xc);
    iVar12 = atoi(pcVar16);
    plVar14 = (long *)std::ostream::operator<<(poVar17,iVar12);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"strtol    : ",0xc);
    strtol(pcVar16,(char **)0x0,10);
    poVar17 = std::ostream::_M_insert<long>((long)poVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"sscanf    : ",0xc);
    plVar14 = (long *)std::ostream::operator<<(poVar17,(int)__str._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    std::ostream::flush();
    iVar11 = iVar11 + 1;
    pcVar16 = pcVar16 + 0xe;
    if (iVar11 == 0xf) {
      iVar11 = 0;
      pcVar16 = 
      "42.4242       -1.           -66666.666666 42            -2348953.3345 59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 45023.4535    99.9999999999 026026.000056 40.           50234896.3345 "
      ;
      do {
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        __str.field_2._8_6_ = (undefined6)((ulong)*(undefined8 *)(pcVar16 + 6) >> 0x10);
        __str.field_2._M_allocated_capacity._0_6_ = (undefined6)*(undefined8 *)pcVar16;
        __str.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)*(undefined8 *)pcVar16 >> 0x30);
        __str._M_string_length = 0xe;
        __str.field_2._M_local_buf[0xe] = '\0';
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x106351);
        local_90 = &local_80;
        plVar21 = plVar14 + 2;
        if ((long *)*plVar14 == plVar21) {
          local_80 = *plVar21;
          lStack_78 = plVar14[3];
        }
        else {
          local_80 = *plVar21;
          local_90 = (long *)*plVar14;
        }
        local_88 = plVar14[1];
        *plVar14 = (long)plVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar15 = 1000000;
        lVar27 = std::chrono::_V2::steady_clock::now();
        do {
          dVar3 = konvert::atof(pcVar16);
          if ((dVar3 == 43.0) && (!NAN(dVar3))) {
            puts(
                "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
                );
          }
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        lVar15 = std::chrono::_V2::steady_clock::now();
        _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
        pcStack_140 = "konvert";
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results_1,(time_result *)&scanfint);
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results,
                     results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1);
        lVar15 = 1000000;
        lVar27 = std::chrono::_V2::steady_clock::now();
        do {
          dVar3 = atof(pcVar16);
          if ((dVar3 == 43.0) && (!NAN(dVar3))) {
            puts(
                "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
                );
          }
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        lVar15 = std::chrono::_V2::steady_clock::now();
        _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
        pcStack_140 = "atof";
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results_1,(time_result *)&scanfint);
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results,
                     results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1);
        lVar15 = 1000000;
        lVar27 = std::chrono::_V2::steady_clock::now();
        do {
          dVar3 = strtod(pcVar16,(char **)0x0);
          if ((dVar3 == 43.0) && (!NAN(dVar3))) {
            puts(
                "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
                );
          }
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        lVar15 = std::chrono::_V2::steady_clock::now();
        _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
        pcStack_140 = "strtod";
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results_1,(time_result *)&scanfint);
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results,
                     results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1);
        lVar15 = 1000000;
        lVar27 = std::chrono::_V2::steady_clock::now();
        do {
          __isoc99_sscanf(pcVar16,"%lf",&scanfint);
          if (((double)_scanfint == 43.0) && (!NAN((double)_scanfint))) {
            puts(
                "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
                );
          }
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        lVar15 = std::chrono::_V2::steady_clock::now();
        _scanfint = (void *)(((double)(lVar15 - lVar27) / 1000.0) / 1000000.0);
        pcStack_140 = "scanf";
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results_1,(time_result *)&scanfint);
        ptVar9 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::
        vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
        ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                      *)&results,
                     results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1);
        ptVar7 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
            super__Vector_impl_data._M_start != ptVar9) {
          lVar15 = (long)ptVar9 -
                   (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uVar19 = lVar15 >> 4;
          lVar27 = 0x3f;
          if (uVar19 != 0) {
            for (; uVar19 >> lVar27 == 0; lVar27 = lVar27 + -1) {
            }
          }
          std::operator()(results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                          _M_impl.super__Vector_impl_data._M_start,ptVar9,
                          ((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar15 < 0x101) {
            std::operator()(ptVar7,ptVar9);
          }
          else {
            ptVar29 = ptVar7 + 0x10;
            std::operator()(ptVar7,ptVar29);
            for (; ptVar29 != ptVar9; ptVar29 = ptVar29 + 1) {
              dVar3 = ptVar29->time;
              pcVar5 = ptVar29->desc;
              dVar2 = ptVar29[-1].time;
              ptVar7 = ptVar29;
              while (dVar3 < dVar2) {
                pcVar6 = ptVar7[-1].desc;
                ptVar7->time = ptVar7[-1].time;
                ptVar7->desc = pcVar6;
                dVar2 = ptVar7[-2].time;
                ptVar7 = ptVar7 + -1;
              }
              ptVar7->time = dVar3;
              ptVar7->desc = pcVar5;
            }
          }
        }
        bench::console::separator();
        printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",local_90,
               "\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
        ptVar7 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_start;
        printf(anon_var_dwarf_7f4b,
               SUB84((results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start)->time,0),
               SUB84(1000000.0 /
                     (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start)->time,0),"\x1b[0;32m",0xf,
               (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                super__Vector_impl_data._M_start)->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
        uVar19 = (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7 >> 4;
        if (1 < uVar19) {
          lVar27 = 2;
          lVar15 = 3;
          do {
            dVar3 = *(double *)((long)ptVar7 + lVar15 * 8 + -8);
            printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar3 / ptVar7->time,0)
                   ,SUB84(dVar3,0),1000000.0 / dVar3,"\x1b[0;37m",lVar27,0xf,(&ptVar7->time)[lVar15]
                   ,"\x1b[0;91m",(ulong)((int)lVar15 + 1)," ","\x1b[0m");
            lVar24 = (1 - uVar19) + lVar27;
            lVar27 = lVar27 + 1;
            lVar15 = lVar15 + 2;
          } while (lVar24 != 1);
        }
        puts("\n");
        ptVar29 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        ptVar9 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_start;
        operator_delete(ptVar7,(long)results_1.
                                     super__Vector_base<time_result,_std::allocator<time_result>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar7);
        if (ptVar9 != (pointer)0x0) {
          operator_delete(ptVar9,(long)ptVar29 - (long)ptVar9);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT26(__str.field_2._M_allocated_capacity._6_2_,
                                   __str.field_2._M_allocated_capacity._0_6_) + 1);
        }
        __isoc99_sscanf(pcVar16,"%lf",&__str);
        *(undefined8 *)(std::chrono::_V2::steady_clock::now + *(long *)(std::cout + -0x18)) = 0x10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"konvert : ",10);
        dVar3 = konvert::atof(pcVar16);
        poVar17 = std::ostream::_M_insert<double>(dVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"atof    : ",10);
        dVar3 = atof(pcVar16);
        poVar17 = std::ostream::_M_insert<double>(dVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"strtod  : ",10);
        dVar3 = strtod(pcVar16,(char **)0x0);
        poVar17 = std::ostream::_M_insert<double>(dVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"sscanf  : ",10);
        poVar17 = std::ostream::_M_insert<double>((double)__str._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        iVar11 = iVar11 + 1;
        pcVar16 = pcVar16 + 0xe;
      } while (iVar11 != 0xf);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {

  std::cout << "Hello, World!" << std::endl;

  /**
   * Benchmark int to string conversion
   */

  int ints[] = { 42, -1, 1600066666, -666, 0, -502345535, 26026, 4, 1999999990 };

  const char *hint =
    "you should not see this output because (==43) is never true, "
    "it's just used to avoid compiler optimisation in the benchmark\n";

  char str[16]  = "";
  char cstr[16] = "";

  for(auto const value: ints){

    time_compare(
      1000000u, "int -> string: " +  std::to_string(value),

      func("sprintf",   [&]{ if( sprintf(str, "%d", value) == 43      ) printf("%s\n",hint); }),
      func("to_str",    [&]{ if( *std::to_string(value).c_str() == 43 ) printf("%s\n",hint); }),
      func("konvert",   [&]{ if( konvert::itoa(value, cstr) == 43     ) printf("%s\n",hint); })
    );

    { std::cout << "konvert   : " << konvert::itoa(value, cstr) << " = \"" << cstr << "\"\n"
                << "sprintf   : " << sprintf(str, "%d", value)  << " = \"" << str  << "\"\n"
                << "to_string : \"" << std::to_string(value) << "\"\n"; }
  }


  /**
   * Benchmark konvert::atoi vs system alternatives
   * - atoi
   * - sscanf("%d")
   */

  const char *str_ints =
    "42            -1            666666666666  -666          -23489535     "
    "0             1028455535    -502345535    202345535     1232348935    "
    "450234535     9999999999999 026026        4             502348965     ";

  unsigned long separation = 14;
  auto pos = str_ints;


  for(auto t=0; t<15; t++) {

    time_compare(
      1000000u, "string -> int: " +  std::string(pos,separation),

      func("konvert",   [&]{ if( konvert::atoi(pos) == 43 )       printf("%s\n",hint); }),
      func("atoi",      [&]{ if( atoi(pos) == 43 )                printf("%s\n",hint); }),
      func("strtol",    [&]{ if( strtol(pos, nullptr,10) == 43 )  printf("%s\n",hint); }),
      func("scanf",     [&]{
        int scanfint; sscanf(pos,"%d",&scanfint);
        if( scanfint == 43 ) printf("%s\n",hint); })
    );

    { int scanfres; sscanf(pos, "%d", &scanfres);
      std::cout << "konvert   : " << konvert::atoi(pos)      << std::endl
                << "konvert_l : " << konvert::atol(pos)      << std::endl
                << "atoi      : " << atoi(pos)               << std::endl
                << "strtol    : " << strtol(pos, nullptr,10) << std::endl
                << "sscanf    : " << scanfres                << std::endl; }

    pos += separation;
  }


  /**
   * Benchmark konvert::atof vs system alternatives
   * - atof
   * - sscanf("%lf")
   */

  const char *str_doubles =
    "42.4242       -1.           -66666.666666 42            -2348953.3345 "
    "59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 "
    "45023.4535    99.9999999999 026026.000056 40.           50234896.3345 ";

  pos = str_doubles;
  for(auto t=0; t<15; t++){

    time_compare(
      1000000u, "string -> double: " + std::string(pos,separation),

      func("konvert", [&]{ if( konvert::atof(pos) == 43.0 )   printf("%s\n",hint); }),
      func("atof",    [&]{ if( atof(pos) == 43.0 )            printf("%s\n",hint); }),
      func("strtod",  [&]{ if( strtod(pos, nullptr) == 43.0 ) printf("%s\n",hint); }),
      func("scanf",   [&]{
        double scanfd; sscanf(pos,"%lf",&scanfd);
        if( scanfd == 43.0 ) printf("%s\n",hint); })
    );


    { double scanfd; sscanf(pos, "%lf", &scanfd);
      std::cout << std::setprecision(16)
                << "konvert : " << konvert::atof(pos)   << std::endl
                << "atof    : " << atof(pos)            << std::endl
                << "strtod  : " << strtod(pos, nullptr) << std::endl
                << "sscanf  : " << scanfd               << std::endl; }

    pos += separation;
  }
}